

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp.cc
# Opt level: O3

void __thiscall mp::SPAdapter::ExtractRandomTerms(SPAdapter *this)

{
  double dVar1;
  double dVar2;
  pointer pRVar3;
  ColProblem *pCVar4;
  pointer piVar5;
  pointer piVar6;
  pointer piVar7;
  pointer piVar8;
  pointer pdVar9;
  pointer piVar10;
  pointer pdVar11;
  pointer pBVar12;
  Expr e;
  byte bVar13;
  SPAdapter *pSVar14;
  SparseMatrix<double> *pSVar15;
  int iVar16;
  pointer pRVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  size_type __new_size;
  int *piVar25;
  uint uVar26;
  VariableCollector collector;
  SparseMatrix<double_*> var2con;
  allocator_type local_111;
  pointer local_110;
  SPAdapter *local_108;
  ColProblem *local_100;
  SparseMatrix<double> *local_f8;
  int *local_f0;
  pointer local_e8;
  BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
  local_e0;
  undefined4 local_d8;
  SPAdapter *local_d0;
  vector<double,_std::allocator<double>_> local_c8;
  undefined8 local_b0;
  SparseMatrix<double> *local_a8;
  vector<bool,_std::allocator<bool>_> local_a0;
  SparseMatrix<double_*> local_78;
  
  piVar25 = (this->num_stage_cons_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar19 = (long)*piVar25;
  iVar16 = piVar25[1];
  uVar26 = iVar16 + 1;
  std::vector<int,_std::allocator<int>_>::resize(&(this->linear_random_).starts_,(long)(int)uVar26);
  pRVar17 = (this->random_vars_).
            super__Vector_base<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pRVar3 = (this->random_vars_).
           super__Vector_base<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pRVar17 != pRVar3) {
    pCVar4 = this->problem_;
    piVar5 = (this->linear_random_).starts_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (pCVar4->col_starts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (this->con_orig2core_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      iVar24 = piVar6[pRVar17->var_index];
      iVar21 = piVar6[(long)pRVar17->var_index + 1];
      if (iVar21 != iVar24) {
        piVar8 = (pCVar4->row_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar22 = 0;
        do {
          piVar25 = piVar5 + (piVar7[piVar8[iVar24 + lVar22]] - lVar19) + 1;
          *piVar25 = *piVar25 + 1;
          lVar22 = lVar22 + 1;
        } while (iVar21 - iVar24 != (int)lVar22);
      }
      pRVar17 = pRVar17 + 1;
    } while (pRVar17 != pRVar3);
  }
  iVar24 = 0;
  if (iVar16 < 1) {
    __new_size = 0;
  }
  else {
    piVar5 = (this->linear_random_).starts_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar18 = 1;
    do {
      __new_size = (long)piVar5[uVar18] + (long)iVar24;
      piVar5[uVar18] = iVar24;
      uVar18 = uVar18 + 1;
      iVar24 = (int)__new_size;
    } while (uVar26 != uVar18);
  }
  std::vector<int,_std::allocator<int>_>::resize(&(this->linear_random_).indices_,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(&(this->linear_random_).values_,__new_size);
  pRVar17 = (this->random_vars_).
            super__Vector_base<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_110 = (this->random_vars_).
              super__Vector_base<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (pRVar17 != local_110) {
    pCVar4 = this->problem_;
    piVar5 = (this->linear_random_).starts_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (pCVar4->col_starts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (this->con_orig2core_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar8 = (this->linear_random_).indices_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (this->linear_random_).values_.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      iVar16 = piVar6[pRVar17->var_index];
      iVar24 = piVar6[(long)pRVar17->var_index + 1];
      if (iVar24 != iVar16) {
        piVar10 = (pCVar4->row_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar11 = (pCVar4->coefs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar22 = 0;
        do {
          lVar23 = piVar7[piVar10[iVar16 + lVar22]] - lVar19;
          iVar21 = piVar5[lVar23 + 1];
          piVar5[lVar23 + 1] = iVar21 + 1;
          piVar8[iVar21] = pRVar17->var_index;
          pdVar9[iVar21] = -pdVar11[iVar16 + lVar22];
          lVar22 = lVar22 + 1;
        } while (iVar24 - iVar16 != (int)lVar22);
      }
      pRVar17 = pRVar17 + 1;
    } while (pRVar17 != local_110);
  }
  local_d8 = 0;
  local_e0._vptr_BasicExprVisitor = (_func_int **)&PTR__BasicRandomAffineExprExtractor_0019a778;
  local_108 = this;
  local_d0 = this;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_c8,
             (long)(int)((ulong)((long)(this->var_core2orig_).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                (long)(this->var_core2orig_).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start) >> 2),
             (allocator_type *)&local_78);
  local_b0 = 0x3ff0000000000000;
  local_e0._vptr_BasicExprVisitor = (_func_int **)&PTR__VariableCollector_0019a6e8;
  local_78.starts_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)local_78.starts_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start & 0xffffffffffffff00);
  local_a8 = &this->vars_in_nonlinear_;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_a0,
             (long)(int)((ulong)((long)(this->var_core2orig_).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                (long)(this->var_core2orig_).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start) >> 2),(bool *)&local_78,
             &local_111);
  local_100 = (ColProblem *)
              (this->problem_->coefs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
  piVar25 = (local_d0->num_stage_cons_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_110 = (pointer)(long)*piVar25;
  iVar16 = piVar25[1];
  local_f8 = &this->vars_in_nonlinear_;
  std::vector<int,_std::allocator<int>_>::resize(&local_a8->starts_,(long)iVar16 + 1);
  if (0 < iVar16) {
    piVar25 = (int *)0x0;
    local_f0 = (int *)(long)iVar16;
    do {
      uVar18 = (ulong)(local_d0->con_core2orig_).super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start[(long)piVar25 + (long)local_110];
      pBVar12 = (local_d0->problem_->super_Problem).nonlinear_cons_.
                super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((uVar18 < (ulong)((long)(local_d0->problem_->super_Problem).nonlinear_cons_.
                                  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar12 >> 3))
         && (e.super_ExprBase.impl_ = (ExprBase)pBVar12[uVar18].super_ExprBase.impl_,
            e.super_ExprBase.impl_ != (Impl *)0x0)) {
        BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
        ::Visit(&local_e0,e);
      }
      pSVar15 = local_a8;
      iVar16 = (int)((ulong)((long)(local_a8->indices_).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)(local_a8->indices_).super__Vector_base<int,_std::allocator<int>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 2);
      (local_a8->starts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[(long)piVar25 + 1] = iVar16;
      std::vector<int,_std::allocator<int>_>::resize(&local_a8->indices_,(long)iVar16);
      std::vector<double,_std::allocator<double>_>::resize(&pSVar15->values_,(long)iVar16);
      piVar5 = (local_a8->starts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar16 = piVar5[(long)piVar25];
      lVar22 = (long)iVar16;
      piVar25 = (int *)((long)piVar25 + 1);
      iVar24 = piVar5[(long)piVar25];
      if (iVar16 < iVar24) {
        piVar5 = (local_a8->indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar9 = (local_a8->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          iVar16 = piVar5[lVar22];
          uVar18 = (ulong)iVar16;
          pdVar9[lVar22] =
               local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar18];
          local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar18] = 0.0;
          iVar21 = iVar16 + 0x3f;
          if (-1 < (long)uVar18) {
            iVar21 = iVar16;
          }
          bVar13 = (byte)iVar16 & 0x3f;
          local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p
          [(long)(iVar21 >> 6) + ((ulong)((uVar18 & 0x800000000000003f) < 0x8000000000000001) - 1)]
               = local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [(long)(iVar21 >> 6) +
                  ((ulong)((uVar18 & 0x800000000000003f) < 0x8000000000000001) - 1)] &
                 (-2L << bVar13 | 0xfffffffffffffffeU >> 0x40 - bVar13);
          lVar22 = lVar22 + 1;
        } while (iVar24 != lVar22);
      }
    } while (piVar25 != local_f0);
  }
  pSVar14 = local_108;
  local_78.values_.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.values_.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.indices_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_78.indices_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_78.starts_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_78.indices_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.starts_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (int *)0x0;
  local_78.starts_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_78.values_.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar26 = (uint)((ulong)((long)(local_108->var_core2orig_).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(local_108->var_core2orig_).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 2);
  internal::Transpose(local_f8,&local_78,uVar26);
  pCVar4 = pSVar14->problem_;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            ((vector<double,std::allocator<double>> *)&pSVar14->core_coefs_,local_100,
             (long)(local_100->super_Problem).super_SuffixManager.suffixes_ +
             (long)(pCVar4->col_starts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [(int)((ulong)((long)(pCVar4->super_Problem).vars_.
                                        super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pCVar4->super_Problem).vars_.
                                       super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 4)] * 8 + -0x40
            );
  if (0 < (int)uVar26) {
    local_f8 = (SparseMatrix<double> *)
               (pSVar14->var_core2orig_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_100 = pSVar14->problem_;
    pdVar9 = (pSVar14->core_coefs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_e8 = (local_100->col_starts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    piVar5 = (pSVar14->con_core2orig_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_110 = (pointer)(ulong)(uVar26 & 0x7fffffff);
    local_f0 = local_78.starts_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    uVar18 = 0;
    iVar16 = *local_78.starts_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      iVar24 = local_78.starts_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar18 + 1];
      if (iVar16 < iVar24) {
        piVar6 = (local_100->row_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar22 = (long)iVar16;
        iVar16 = local_e8[*(int *)((long)&(local_f8->starts_).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start + uVar18 * 4)];
        do {
          lVar23 = 0;
          do {
            lVar20 = lVar23;
            lVar23 = lVar20 + 1;
          } while (piVar6[iVar16 + lVar20] !=
                   piVar5[local_78.indices_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar22] + lVar19]);
          dVar1 = pdVar9[iVar16 + lVar20];
          dVar2 = *local_78.values_.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar22];
          *local_78.values_.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
           super__Vector_impl_data._M_start[lVar22] = dVar1;
          pdVar9[iVar16 + lVar20] = dVar2 + dVar1;
          lVar22 = lVar22 + 1;
          iVar16 = iVar16 + (int)(lVar20 + 1) + -1;
        } while (lVar22 != iVar24);
      }
      uVar18 = uVar18 + 1;
      iVar16 = iVar24;
    } while ((pointer)uVar18 != local_110);
  }
  if (local_78.values_.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.values_.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_78.values_.super__Vector_base<double_*,_std::allocator<double_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.values_.super__Vector_base<double_*,_std::allocator<double_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.indices_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.indices_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.indices_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.indices_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_78.starts_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (int *)0x0) {
    operator_delete(local_78.starts_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.starts_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.starts_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_e0._vptr_BasicExprVisitor = (_func_int **)&PTR__VariableCollector_0019a6e8;
  if (local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  local_e0._vptr_BasicExprVisitor = (_func_int **)&PTR__BasicRandomAffineExprExtractor_0019a778;
  if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SPAdapter::ExtractRandomTerms() {
  int num_stage1_cons = num_stage_cons_[0];
  int num_stage2_cons = num_stage_cons_[1];

  // A matrix containing linear terms involving random variables.
  // The major dimension is equal to the number of second-stage constraints.
  linear_random_.resize_major(num_stage2_cons);

  // Count random variables in second-stage constraints.
  for (auto i = random_vars_.begin(), end = random_vars_.end(); i != end; ++i) {
    for (int k = problem_.col_start(i->var_index),
         end = problem_.col_start(i->var_index + 1); k != end; ++k) {
       int core_con_index = con_orig2core_[problem_.row_index(k)];
       assert(core_con_index >= num_stage1_cons);
       ++linear_random_.start(core_con_index - num_stage1_cons + 1);
    }
  }
  // Acummulate counts to get vector starts.
  int start = 0;
  for (int i = 1; i <= num_stage2_cons; ++i) {
    int next = start + linear_random_.start(i);
    linear_random_.start(i) = start;
    start = next;
  }

  // Map second-stage constraints to random variables that appear linearly
  // in them.
  linear_random_.resize_elements(start);
  for (auto i = random_vars_.begin(), end = random_vars_.end(); i != end; ++i) {
    for (int k = problem_.col_start(i->var_index),
         end = problem_.col_start(i->var_index + 1); k != end; ++k) {
       int core_con_index = con_orig2core_[problem_.row_index(k)];
       assert(core_con_index >= num_stage1_cons);
       int index = core_con_index - num_stage1_cons + 1;
       int element_index = linear_random_.start(index)++;
       linear_random_.index(element_index) = i->var_index;
       linear_random_.value(element_index) = -problem_.value(k);
    }
  }

  // Get variables that appear in nonlinear parts of constraint expressions.
  VariableCollector collector(*this, vars_in_nonlinear_);
  const double *coefs = problem_.values();
  collector.Collect();

  // Convert vars_in_nonlinear_ to column-major form.
  int num_vars = this->num_vars();
  SparseMatrix<double*> var2con;
  internal::Transpose(vars_in_nonlinear_, var2con, num_vars);

  // Combine the first scenario with core coefficients.
  core_coefs_.assign(coefs, coefs + problem_.col_start(problem_.num_vars()));
  for (int core_var_index = 0; core_var_index < num_vars; ++core_var_index) {
    int var_index = var_core2orig_[core_var_index];
    int elt_index = problem_.col_start(var_index);
    for (int j = var2con.start(core_var_index),
         n = var2con.start(core_var_index + 1); j < n; ++j) {
      int con_index = con_core2orig_[var2con.index(j) + num_stage1_cons];
      while (problem_.row_index(elt_index) != con_index)
        ++elt_index;
      assert(elt_index < problem_.col_start(var_index + 1));
      double coef = core_coefs_[elt_index] + *var2con.value(j);
      *var2con.value(j) = core_coefs_[elt_index];
      core_coefs_[elt_index] = coef;
    }
  }
}